

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pesPacket.h
# Opt level: O2

void set_pts_int(uint8_t *p,int64_t pts,int preffix)

{
  *p = ((byte)((ulong)pts >> 0x1d) & 0xe) + (char)preffix + '\x01';
  p[1] = (uint8_t)((ulong)pts >> 0x16);
  p[2] = (byte)((ulong)pts >> 0xe) | 1;
  p[3] = (uint8_t)((uint)pts >> 7);
  p[4] = (char)pts * '\x02' + '\x01';
  return;
}

Assistant:

static void set_pts_int(uint8_t *p, const int64_t pts, const int preffix)
{
    p[0] = static_cast<uint8_t>(preffix + (((pts >> 30) & 0x07) << 1) + 1);
    uint16_t val = static_cast<uint16_t>(((pts >> 15) & 0x7fff) << 1) + 1;
    p[1] = val >> 8;
    p[2] = val & 0xff;

    val = static_cast<uint16_t>((pts & 0x7fff) << 1) + 1;
    p[3] = val >> 8;
    p[4] = val & 0xff;
}